

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall SQClass::SQClass(SQClass *this,SQSharedState *ss,SQClass *base)

{
  SQTable *pSVar1;
  _HashNode *in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  SQSharedState *in_RSI;
  SQTable *in_RDI;
  SQInteger _n_;
  SQInteger in_stack_ffffffffffffff58;
  SQSharedState *in_stack_ffffffffffffff60;
  SQObjectPtr *in_stack_ffffffffffffff68;
  SQObjectPtr *in_stack_ffffffffffffff70;
  SQSharedState **local_50;
  long local_30;
  
  SQCollectable::SQCollectable((SQCollectable *)in_stack_ffffffffffffff60);
  (in_RDI->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQClass_0015a7c0;
  sqvector<SQClassMember>::sqvector((sqvector<SQClassMember> *)&in_RDI->_nodes);
  sqvector<SQClassMember>::sqvector((sqvector<SQClassMember> *)(in_RDI + 1));
  local_50 = (SQSharedState **)&in_RDI[1].super_SQDelegable.super_SQCollectable._next;
  pSVar1 = in_RDI + 4;
  do {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_50);
    local_50 = local_50 + 2;
  } while (local_50 != (SQSharedState **)&(pSVar1->super_SQDelegable)._delegate);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&in_RDI[4].super_SQDelegable._delegate);
  in_RDI->_firstfree = in_RDX;
  in_RDI[4]._nodes = (_HashNode *)0x0;
  in_RDI[4]._numofnodes = 0;
  in_RDI[5].super_SQDelegable.super_SQCollectable.super_SQRefCounted._uiRef = 0;
  *(undefined1 *)&in_RDI[4]._usednodes = 0;
  in_RDI[5].super_SQDelegable.super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)0xffffffffffffffff;
  if (in_RDI->_firstfree != (_HashNode *)0x0) {
    in_RDI[5].super_SQDelegable.super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
         *(_func_int ***)&in_RDI->_firstfree[0xb].val.super_SQObject;
    in_RDI[5].super_SQDelegable.super_SQCollectable.super_SQRefCounted._uiRef =
         (SQUnsignedInteger)in_RDI->_firstfree[0xb].val.super_SQObject._unVal;
    sqvector<SQClassMember>::copy
              ((sqvector<SQClassMember> *)&in_RDI->_nodes,
               (EVP_PKEY_CTX *)&in_RDX[1].key.super_SQObject._unVal,src);
    sqvector<SQClassMember>::copy
              ((sqvector<SQClassMember> *)(in_RDI + 1),
               (EVP_PKEY_CTX *)&in_RDX[2].val.super_SQObject._unVal,src_00);
    for (local_30 = 0; local_30 < 0x12; local_30 = local_30 + 1) {
      ::SQObjectPtr::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    (in_RDI->_firstfree->val).super_SQObject._unVal.pTable =
         (SQTable *)
         ((long)&(((in_RDI->_firstfree->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                 super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + 1);
  }
  if (in_RDX == (_HashNode *)0x0) {
    pSVar1 = SQTable::Create(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    pSVar1 = SQTable::Clone(in_RDI);
  }
  (in_RDI->super_SQDelegable)._delegate = pSVar1;
  pSVar1 = (in_RDI->super_SQDelegable)._delegate;
  (pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
       (pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef + 1;
  (in_RDI->super_SQDelegable).super_SQCollectable._next = (SQCollectable *)0x0;
  (in_RDI->super_SQDelegable).super_SQCollectable._prev = (SQCollectable *)0x0;
  (in_RDI->super_SQDelegable).super_SQCollectable._sharedstate = in_RSI;
  SQCollectable::AddToChain
            (&((in_RDI->super_SQDelegable).super_SQCollectable._sharedstate)->_gc_chain,
             (SQCollectable_conflict *)in_RDI);
  return;
}

Assistant:

SQClass::SQClass(SQSharedState *ss,SQClass *base)
{
    _base = base;
    _typetag = 0;
    _hook = NULL;
    _udsize = 0;
    _locked = false;
    _constructoridx = -1;
    if(_base) {
        _constructoridx = _base->_constructoridx;
        _udsize = _base->_udsize;
        _defaultvalues.copy(base->_defaultvalues);
        _methods.copy(base->_methods);
        _COPY_VECTOR(_metamethods,base->_metamethods,MT_LAST);
        __ObjAddRef(_base);
    }
    _members = base?base->_members->Clone() : SQTable::Create(ss,0);
    __ObjAddRef(_members);

    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain, this);
}